

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O3

void __thiscall
asmjit::v1_14::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  ZoneAllocator *__src;
  uint uVar4;
  ZoneVectorBase *__dest;
  uint uVar5;
  ulong uVar6;
  uint extraout_EDX;
  uint sizeOfT;
  ulong uVar7;
  undefined4 in_register_00000034;
  ZoneVectorBase *this_00;
  ZoneAllocator *allocator;
  ZoneVectorBase *this_01;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uStack_40;
  
  this_00 = (ZoneVectorBase *)CONCAT44(in_register_00000034,side);
  uVar6 = (ulong)side;
  plVar2 = *(long **)(this + uVar6 * 8 + 8);
  if (plVar2[2] == plVar2[3]) {
    this_00 = (ZoneVectorBase *)plVar2[side == 0];
    if (this_00 == (ZoneVectorBase *)0x0) {
      if (*(long **)(this + (ulong)(side == 0) * 8 + 8) == plVar2) {
        plVar2[2] = middleIndex + (long)plVar2;
        plVar2[3] = middleIndex + (long)plVar2;
      }
      return;
    }
    if ((long *)(&this_00->_data)[uVar6] != plVar2) goto LAB_0012af94;
    plVar3 = *(long **)this;
    if (*plVar3 != 0) {
      *plVar2 = plVar3[10];
      plVar3[10] = (long)plVar2;
      (&this_00->_data)[uVar6] = (void *)0x0;
      *(ZoneVectorBase **)(this + uVar6 * 8 + 8) = this_00;
      return;
    }
  }
  else {
    _cleanupBlock();
LAB_0012af94:
    _cleanupBlock();
  }
  _cleanupBlock();
  uVar1 = *(uint *)(this + 0xc);
  uVar5 = (uint)uVar6;
  if (uVar5 <= uVar1) {
    return;
  }
  if (this_00->_data == (void *)0x0) {
    ZoneVectorBase::_reserve();
    return;
  }
  uVar10 = (ulong)extraout_EDX;
  allocator = (ZoneAllocator *)((uVar6 & 0xffffffff) * uVar10);
  this_01 = this_00;
  __dest = (ZoneVectorBase *)
           ZoneAllocator::_alloc((ZoneAllocator *)this_00,(size_t)allocator,&uStack_40);
  if (__dest == (ZoneVectorBase *)0x0) {
    return;
  }
  uVar4 = (uint)(uStack_40 / uVar10);
  if (uVar4 < uVar5) {
    ZoneVectorBase::_reserve();
LAB_0012b08a:
    ZoneVectorBase::_reserve();
  }
  else {
    __src = *(ZoneAllocator **)this;
    if ((__src == (ZoneAllocator *)0x0) || ((ulong)*(uint *)(this + 8) == 0)) {
LAB_0012b052:
      *(ZoneVectorBase **)this = __dest;
      *(uint *)(this + 0xc) = uVar4;
      return;
    }
    allocator = __src;
    this_01 = __dest;
    memcpy(__dest,__src,*(uint *)(this + 8) * uVar10);
    if (this_00->_data == (void *)0x0) goto LAB_0012b08a;
    if ((ulong)uVar1 != 0) {
      uVar10 = uVar1 * uVar10;
      if (uVar10 < 0x201) {
        ZoneVectorBase::_reserve();
      }
      else {
        ZoneAllocator::_releaseDynamic((ZoneAllocator *)this_00,__src,uVar10);
      }
      goto LAB_0012b052;
    }
  }
  ZoneVectorBase::_reserve();
  if ((uint)uVar6 <= this_01->_capacity) {
    return;
  }
  uVar8 = (ulong)sizeOfT;
  uVar9 = this_01->_capacity * uVar8;
  uVar7 = (uVar6 & 0xffffffff) * uVar8;
  uVar10 = 0x20;
  if (((0x1f < uVar9) && (uVar10 = 0x80, 0x7f < uVar9)) && (uVar10 = 0x200, 0x200 < uVar9)) {
    uVar10 = uVar9;
  }
  if (uVar10 < uVar7) {
    uVar10 = uVar7 - 1 >> 1 | uVar7 - 1;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    uVar10 = uVar10 >> 0x10 | uVar10;
    uVar10 = (uVar10 >> 0x20 | uVar10) + 1;
    if (uVar10 < uVar7) goto LAB_0012b149;
    if (0x1000000 < uVar10) {
      uVar10 = ((uint)uVar7 & 0xffffff) + uVar7;
    }
  }
  uVar6 = 0xffffffff;
  if (uVar10 / uVar8 < 0xffffffff) {
    uVar6 = uVar10 / uVar8;
  }
LAB_0012b149:
  ZoneVectorBase::_reserve(this_01,allocator,sizeOfT,(uint32_t)uVar6);
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}